

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

iterator divsufsortxx::helper::
         pivot<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                   (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator first
                   ,iterator last)

{
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_00;
  iterator v2;
  iterator v1;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_01;
  iterator v4;
  iterator v5;
  pos_type unaff_RBX;
  pos_type pVar1;
  pos_type pVar2;
  BitmapArray<long> *unaff_R12;
  pos_type unaff_R13;
  pos_type pVar3;
  BitmapArray<long> *unaff_R14;
  pos_type unaff_R15;
  ulong uVar4;
  iterator v1_00;
  iterator v2_00;
  iterator v2_01;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  iterator v3;
  iterator v3_00;
  iterator v3_01;
  iterator v3_02;
  undefined8 in_stack_ffffffffffffffc0;
  BitmapArray<long> *pBVar8;
  undefined8 in_stack_ffffffffffffffc8;
  
  pVar1 = last.pos_;
  iVar7.array_ = last.array_;
  pVar2 = first.pos_;
  iVar5.array_ = first.array_;
  uVar4 = pVar1 - pVar2;
  pVar3 = (long)uVar4 / 2 + pVar2;
  if ((long)uVar4 < 0x201) {
    if ((long)uVar4 < 0x21) {
      v2_00.pos_ = pVar3;
      v2_00.array_ = iVar5.array_;
      v3.pos_ = pVar1 - 1;
      v3.array_ = iVar7.array_;
      iVar5 = median3<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                        (Td,first,v2_00,v3);
      return iVar5;
    }
    Td_01.m_PA.array_ = (BitmapArray<long> *)in_stack_ffffffffffffffc8;
    Td_01.m_Td = (char *)in_stack_ffffffffffffffc0;
    Td_01.m_PA.pos_ = unaff_RBX;
    v1.pos_ = (pos_type)iVar7.array_;
    v1.array_ = (BitmapArray<long> *)((pVar1 - 1) - (uVar4 >> 2));
    v2.pos_ = (pos_type)iVar7.array_;
    v2.array_ = (BitmapArray<long> *)Td.m_PA.pos_;
    v4.pos_ = unaff_R13;
    v4.array_ = unaff_R12;
    v5.pos_ = unaff_R15;
    v5.array_ = unaff_R14;
    iVar5 = median5<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                      (Td_01,v1,v2,Td._0_16_,v4,v5);
  }
  else {
    uVar4 = uVar4 >> 3;
    iVar6.pos_ = uVar4 + pVar2;
    iVar6.array_ = iVar5.array_;
    v3_00.pos_ = pVar2 + uVar4 * 2;
    v3_00.array_ = iVar5.array_;
    pBVar8 = Td.m_PA.array_;
    pVar2 = Td.m_PA.pos_;
    iVar6 = median3<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                      (Td,first,iVar6,v3_00);
    iVar5.pos_ = pVar3 - uVar4;
    v2_01.pos_ = pVar3;
    v2_01.array_ = iVar5.array_;
    v3_01.pos_ = uVar4 + pVar3;
    v3_01.array_ = iVar5.array_;
    iVar5 = median3<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                      (Td,iVar5,v2_01,v3_01);
    pVar1 = pVar1 - 1;
    v1_00.pos_ = pVar1 + uVar4 * -2;
    iVar7.pos_ = pVar1 - uVar4;
    v1_00.array_ = iVar7.array_;
    v3_02.pos_ = pVar1;
    v3_02.array_ = iVar7.array_;
    iVar7 = median3<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                      (Td,v1_00,iVar7,v3_02);
    Td_00.m_PA.array_ = pBVar8;
    Td_00.m_Td = Td.m_Td;
    Td_00.m_PA.pos_ = pVar2;
    iVar5 = median3<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                      (Td_00,iVar6,iVar5,iVar7);
  }
  return iVar5;
}

Assistant:

SAIterator_type pivot(const StringIterator_type Td, SAIterator_type first,
                      SAIterator_type last) {
  typedef typename std::iterator_traits<SAIterator_type>::difference_type difference_type;
  difference_type t = last - first;
  SAIterator_type middle = first + t / 2;

  if (t <= 512) {
    if (t <= 32) {
      return median3(Td, first, middle, last - 1);
    } else {
      t >>= 2;
      return median5(Td, first, first + t, middle, last - 1 - t, last - 1);
    }
  }
  t >>= 3;
  return median3(Td, median3(Td, first, first + t, first + (t << 1)),
                 median3(Td, middle - t, middle, middle + t),
                 median3(Td, last - 1 - (t << 1), last - 1 - t, last - 1));
}